

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O1

JavascriptFunction * __thiscall
Js::JavascriptStackWalker::UpdateFrame(JavascriptStackWalker *this,bool includeInlineFrames)

{
  InlinedFrameWalker *self;
  byte bVar1;
  InterpreterStackFrame *pIVar2;
  size_t sVar3;
  void *pvVar4;
  code *pcVar5;
  bool bVar6;
  int loopNum;
  JavascriptFunction *obj;
  CallInfo CVar7;
  JavascriptFunction *pJVar8;
  undefined4 *puVar9;
  ScriptFunction *pSVar10;
  JavascriptFunction *pJVar11;
  uint uVar12;
  char *message;
  char *error;
  uint lineNumber;
  int iVar13;
  
  bVar6 = CheckJavascriptFrame(this,includeInlineFrames);
  uVar12 = *(uint *)&this->field_0x50;
  *(ushort *)&this->field_0x50 = ((ushort)uVar12 & 0xfffb) + (ushort)bVar6 * 4;
  if (!bVar6 && (uVar12 & 1) == 0) {
    return (JavascriptFunction *)0x0;
  }
  obj = GetCurrentFunction(this,true);
  CVar7 = GetCallInfo(this,false);
  pIVar2 = this->interpreterFrame;
  iVar13 = CVar7._0_4_;
  if (pIVar2 == (InterpreterStackFrame *)0x0) {
    if ((*(ushort *)&this->field_0x50 & 8) != 0) goto LAB_00afc376;
    if ((this->lastInternalFrameInfo).codeAddress == (void *)0x0) {
      uVar12 = (uint)(*(ushort *)&this->field_0x50 >> 1);
    }
    else {
      uVar12._0_1_ = (this->lastInternalFrameInfo).hasInlinedFramesOnStack;
      uVar12._1_1_ = (this->lastInternalFrameInfo).previousInterpreterFrameIsFromBailout;
      uVar12._2_2_ = *(undefined2 *)&(this->lastInternalFrameInfo).field_0x2a;
    }
    if (((uVar12 & 1) != 0) && (-1 < iVar13 || !includeInlineFrames)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                  ,0x25c,
                                  "(!HasInlinedFramesOnStack() || (includeInlineFrames && isCurrentPhysicalFrameForLoopBody))"
                                  ,
                                  "!HasInlinedFramesOnStack() || (includeInlineFrames && isCurrentPhysicalFrameForLoopBody)"
                                 );
      if (!bVar6) goto LAB_00afc39a;
      *puVar9 = 0;
    }
    pvVar4 = (this->lastInternalFrameInfo).codeAddress;
    if (pvVar4 == (void *)0x0) {
      bVar1 = (byte)this->field_0x50 >> 1;
    }
    else {
      bVar1 = (this->lastInternalFrameInfo).hasInlinedFramesOnStack;
    }
    if (((~includeInlineFrames | bVar1) & 1) != 0) goto LAB_00afc376;
    if (pvVar4 != (void *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                  ,0x262,"(lastInternalFrameInfo.codeAddress == nullptr)",
                                  "lastInternalFrameInfo.codeAddress == nullptr");
      if (!bVar6) goto LAB_00afc39a;
      *puVar9 = 0;
    }
    pSVar10 = VarTo<Js::ScriptFunction,Js::JavascriptFunction>(obj);
    bVar6 = InlinedFrameWalker::FromPhysicalFrame
                      (&this->inlinedFrameWalker,&this->currentFrame,pSVar10,false,-1,
                       (JavascriptStackWalker *)0x0,false,false);
    if (!bVar6) goto LAB_00afc376;
    bVar6 = InlinedFrameWalker::Next(&this->inlinedFrameWalker,&this->inlinedFrameCallInfo);
    *(ushort *)&this->field_0x50 =
         ((ushort)*(undefined4 *)&this->field_0x50 & 0xfffc) + (ushort)bVar6 + 2;
    if (bVar6) goto LAB_00afc376;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    error = "(inlinedFramesBeingWalked)";
    message = "inlinedFramesBeingWalked";
    lineNumber = 0x271;
  }
  else {
    if ((this->lastInternalFrameInfo).codeAddress != (void *)0x0) {
      this->field_0x50 = this->field_0x50 | 0x80;
    }
    if (((byte)pIVar2[0xd4] & 8) == 0) {
      pJVar8 = StackScriptFunction::GetCurrentFunctionObject
                         (*(JavascriptFunction **)(pIVar2 + 0x80));
      if (pJVar8 != obj) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                    ,0x255,
                                    "(StackScriptFunction::GetCurrentFunctionObject(this->interpreterFrame->GetJavascriptFunction()) == function)"
                                    ,
                                    "StackScriptFunction::GetCurrentFunctionObject(this->interpreterFrame->GetJavascriptFunction()) == function"
                                   );
        if (!bVar6) goto LAB_00afc39a;
        *puVar9 = 0;
      }
      this->field_0x50 = this->field_0x50 & 0xbf;
      goto LAB_00afc376;
    }
    uVar12 = *(uint *)&this->field_0x50;
    *(ushort *)&this->field_0x50 = (ushort)uVar12 | 0x40;
    if ((uVar12 & 1) != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                  ,0x229,"(!inlinedFramesBeingWalked)","!inlinedFramesBeingWalked");
      if (!bVar6) goto LAB_00afc39a;
      *puVar9 = 0;
    }
    if (!includeInlineFrames) {
      if ((iVar13 < 0) && ((this->lastInternalFrameInfo).codeAddress == (void *)0x0)) {
        sVar3 = (this->currentFrame).stackCheckCodeHeight;
        (this->lastInternalFrameInfo).codeAddress = (this->currentFrame).codeAddr;
        (this->lastInternalFrameInfo).framePointer = (this->currentFrame).frame;
        (this->lastInternalFrameInfo).stackCheckCodeHeight = sVar3;
        (this->lastInternalFrameInfo).frameType = InternalFrameType_LoopBody;
        (this->lastInternalFrameInfo).function = obj;
        (this->lastInternalFrameInfo).hasInlinedFramesOnStack = false;
        (this->lastInternalFrameInfo).previousInterpreterFrameIsFromBailout = true;
      }
      goto LAB_00afc376;
    }
    loopNum = -1;
    if (iVar13 < 0) {
      loopNum = *(int *)(this->tempInterpreterFrame + 0xcc);
    }
    self = &this->inlinedFrameWalker;
    pSVar10 = VarTo<Js::ScriptFunction,Js::JavascriptFunction>(obj);
    bVar6 = InlinedFrameWalker::FromPhysicalFrame
                      (self,&this->currentFrame,pSVar10,true,loopNum,this,false,false);
    if (bVar6) {
      bVar6 = InlinedFrameWalker::Next(self,&this->inlinedFrameCallInfo);
      *(ushort *)&this->field_0x50 =
           ((ushort)*(undefined4 *)&this->field_0x50 & 0xfffc) + (ushort)bVar6 + 2;
      if (!bVar6) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                    ,0x23d,"(inlinedFramesBeingWalked)","inlinedFramesBeingWalked");
        if (!bVar6) goto LAB_00afc39a;
        *puVar9 = 0;
      }
      pJVar8 = StackScriptFunction::GetCurrentFunctionObject
                         (*(JavascriptFunction **)(this->interpreterFrame + 0x80));
      pJVar11 = InlinedFrameWalker::GetFunctionObject(self);
      if (pJVar8 == pJVar11) goto LAB_00afc376;
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      error = 
      "(StackScriptFunction::GetCurrentFunctionObject(this->interpreterFrame->GetJavascriptFunction()) == inlinedFrameWalker.GetFunctionObject())"
      ;
      message = 
      "StackScriptFunction::GetCurrentFunctionObject(this->interpreterFrame->GetJavascriptFunction()) == inlinedFrameWalker.GetFunctionObject()"
      ;
      lineNumber = 0x23e;
    }
    else {
      if (-1 < iVar13) goto LAB_00afc376;
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar9 = 1;
      error = "(!isCurrentPhysicalFrameForLoopBody)";
      message = "!isCurrentPhysicalFrameForLoopBody";
      lineNumber = 0x242;
    }
  }
  bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                              ,lineNumber,error,message);
  if (!bVar6) {
LAB_00afc39a:
    pcVar5 = (code *)invalidInstructionException();
    (*pcVar5)();
  }
  *puVar9 = 0;
LAB_00afc376:
  this->scriptContext =
       (((((obj->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  return obj;
}

Assistant:

Js::JavascriptFunction * JavascriptStackWalker::UpdateFrame(bool includeInlineFrames)
    {
        this->isJavascriptFrame = this->CheckJavascriptFrame(includeInlineFrames);

        if (this->IsJavascriptFrame())
        {
            // In case we have a cross site thunk, update the script context
            Js::JavascriptFunction *function = this->GetCurrentFunction();

#if ENABLE_NATIVE_CODEGEN
            bool isCurrentPhysicalFrameForLoopBody = this->IsCurrentPhysicalFrameForLoopBody();
#endif
            if (this->interpreterFrame)
            {
#if ENABLE_NATIVE_CODEGEN
                if (lastInternalFrameInfo.codeAddress != nullptr)
                {
                    this->previousInterpreterFrameIsForLoopBody = true;
                }
#endif

                // We might've bailed out of an inlinee, so check if there were any inlinees.
                if (this->interpreterFrame->TestFlags(InterpreterStackFrameFlags_FromBailOut))
                {
                    previousInterpreterFrameIsFromBailout = true;

#if ENABLE_NATIVE_CODEGEN
                    Assert(!inlinedFramesBeingWalked);
                    if (includeInlineFrames)
                    {
                        int loopNum = -1;
                        if (isCurrentPhysicalFrameForLoopBody)
                        {
                            loopNum = this->tempInterpreterFrame->GetCurrentLoopNum();
                        }

                        bool hasInlinedFramesOnStack = InlinedFrameWalker::FromPhysicalFrame(inlinedFrameWalker, currentFrame,
                            VarTo<ScriptFunction>(function), true /*fromBailout*/, loopNum, this, false /*useInternalFrameInfo*/, false /*noAlloc*/);

                        if (hasInlinedFramesOnStack)
                        {
                            // We're now back in the state where currentFrame == physical frame of the inliner, but
                            // since interpreterFrame != null, we'll pick values from the interpreterFrame (the bailout
                            // frame of the inliner). Set a flag to tell the stack walker that it needs to start from the
                            // inlinee frames on the stack when Walk() is called.
                            this->inlinedFramesBeingWalked = inlinedFrameWalker.Next(inlinedFrameCallInfo);
                            this->hasInlinedFramesOnStack = hasInlinedFramesOnStack;
                            Assert(inlinedFramesBeingWalked);
                            Assert(StackScriptFunction::GetCurrentFunctionObject(this->interpreterFrame->GetJavascriptFunction()) == inlinedFrameWalker.GetFunctionObject());
                        }
                        else
                        {
                            Assert(!isCurrentPhysicalFrameForLoopBody);
                        }
                    }
                    else if (isCurrentPhysicalFrameForLoopBody)
                    {
                        // Getting here is only possible when the current interpreterFrame is for a function which
                        // encountered a bailout after getting inlined in a jitted loop body. If we are not including
                        // inlined frames in the stack walk, we need to set the codeAddress on lastInternalFrameInfo,
                        // which would have otherwise been set upon closing the inlinedFrameWalker, now.
                        // Note that we already have an assert in CheckJavascriptFrame to ensure this.
                        SetCachedInternalFrameInfo(InternalFrameType_LoopBody, function, false /*hasInlinedFramesOnStack*/, true /*previousInterpreterFrameIsFromBailout*/);
                    }
#else
                    // How did we bail out when JIT was disabled?
                    Assert(false);
#endif
                }
                else
                {
                    Assert(StackScriptFunction::GetCurrentFunctionObject(this->interpreterFrame->GetJavascriptFunction()) == function);
                    previousInterpreterFrameIsFromBailout = false;
                }
            }
            else if (!this->isNativeLibraryFrame)
            {
#if ENABLE_NATIVE_CODEGEN
                Assert(!HasInlinedFramesOnStack() || (includeInlineFrames && isCurrentPhysicalFrameForLoopBody));

                if (!HasInlinedFramesOnStack() && includeInlineFrames)
                {
                    // Check whether there are inlined frames nested in this native frame. The corresponding check for
                    // a jitted loop body frame should have been done in CheckJavascriptFrame
                    Assert(lastInternalFrameInfo.codeAddress == nullptr);
                    bool inlinedFramesFound = InlinedFrameWalker::FromPhysicalFrame(
                        inlinedFrameWalker,
                        currentFrame,
                        VarTo<ScriptFunction>(function),
                        false,  // fromBailout
                        -1,     // loopNum
                        nullptr,// walker
                        false,  // useInternalFrameInfo
                        false   // noAlloc
                    );
                    if (inlinedFramesFound)
                    {
                        this->inlinedFramesBeingWalked = inlinedFrameWalker.Next(inlinedFrameCallInfo);
                        this->hasInlinedFramesOnStack = true;
                        Assert(inlinedFramesBeingWalked);
                    }
                }
#endif
            }
            this->scriptContext = function->GetScriptContext();
            return function;
        }
        return nullptr;
    }